

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double __thiscall
units::detail::extraValidConversions<units::precise_unit,units::unit>
          (detail *this,double val,precise_unit *start,unit *result)

{
  precise_unit *ppVar1;
  bool bVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  bool local_61;
  bool local_39;
  unit local_38;
  unit local_30;
  precise_unit *local_28;
  unit *result_local;
  precise_unit *start_local;
  double val_local;
  
  local_28 = start;
  result_local = (unit *)this;
  start_local = (precise_unit *)val;
  unit::pow((unit *)&units::m,val,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  bVar2 = precise_unit::has_same_base((precise_unit *)this,&local_30);
  local_39 = false;
  if (bVar2) {
    local_39 = unit::has_same_base((unit *)local_28,(unit *)&J);
  }
  ppVar1 = start_local;
  if (local_39 == false) {
    bVar2 = precise_unit::has_same_base((precise_unit *)result_local,(unit *)&J);
    ppVar1 = local_28;
    local_61 = false;
    if (bVar2) {
      unit::pow((unit *)&units::m,__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
      local_61 = unit::has_same_base((unit *)ppVar1,&local_38);
    }
    ppVar1 = start_local;
    if (local_61 == false) {
      val_local = NAN;
    }
    else {
      dVar3 = precise_unit::multiplier((precise_unit *)result_local);
      dVar4 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
      dVar5 = unit::multiplier((unit *)local_28);
      val_local = (((double)ppVar1 * dVar3) / dVar4) / dVar5;
    }
  }
  else {
    dVar3 = precise_unit::multiplier((precise_unit *)result_local);
    dVar4 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
    dVar5 = unit::multiplier((unit *)local_28);
    val_local = ((double)ppVar1 * dVar3 * dVar4) / dVar5;
  }
  return val_local;
}

Assistant:

inline double
        extraValidConversions(double val, const UX& start, const UX2& result)
    {
        if (start.has_same_base(m.pow(3)) && result.has_same_base(J)) {
            // volume to scf or scm
            return val * start.multiplier() *
                precise::energy::scm.multiplier() / result.multiplier();
        }
        if (start.has_same_base(J) && result.has_same_base(m.pow(3))) {
            // volume to scf or scm
            return val * start.multiplier() /
                precise::energy::scm.multiplier() / result.multiplier();
        }
        return constants::invalid_conversion;
    }